

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void * __thiscall
kj::Arena::allocateBytes(Arena *this,size_t amount,uint alignment,bool hasDisposer)

{
  uint uVar1;
  void *pvVar2;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,hasDisposer) != 0) {
    uVar1 = 8;
    if (8 < alignment) {
      uVar1 = alignment;
    }
    alignment = uVar1;
    amount = amount + (~(ulong)(alignment - 1) & (ulong)(alignment - 1) + 0x10);
  }
  pvVar2 = allocateBytesInternal(this,amount,alignment);
  if (hasDisposer) {
    pvVar2 = (void *)(~(ulong)(alignment - 1) & (long)pvVar2 + (ulong)(alignment - 1) + 0x10);
  }
  return pvVar2;
}

Assistant:

void* Arena::allocateBytes(size_t amount, uint alignment, bool hasDisposer) {
  if (hasDisposer) {
    alignment = kj::max(alignment, alignof(ObjectHeader));
    amount += alignTo(sizeof(ObjectHeader), alignment);
  }

  void* result = allocateBytesInternal(amount, alignment);

  if (hasDisposer) {
    // Reserve space for the ObjectHeader, but don't add it to the object list yet.
    result = alignTo(reinterpret_cast<byte*>(result) + sizeof(ObjectHeader), alignment);
  }

  KJ_DASSERT(reinterpret_cast<uintptr_t>(result) % alignment == 0);
  return result;
}